

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffio.c
# Opt level: O0

void tidyBufAttach(TidyBuffer *buf,byte *bp,uint size)

{
  uint size_local;
  byte *bp_local;
  TidyBuffer *buf_local;
  
  if (buf != (TidyBuffer *)0x0) {
    buf->bp = bp;
    buf->allocated = size;
    buf->size = size;
    buf->next = 0;
    if (buf->allocator == (TidyAllocator *)0x0) {
      setDefaultAllocator(buf);
    }
    return;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/buffio.c"
                ,0x92,"void tidyBufAttach(TidyBuffer *, byte *, uint)");
}

Assistant:

void  TIDY_CALL tidyBufAttach( TidyBuffer* buf, byte* bp, uint size )
{
    assert( buf != NULL );
    buf->bp = bp;
    buf->size = buf->allocated = size;
    buf->next = 0;
    if ( !buf->allocator )
        setDefaultAllocator( buf );
}